

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

bool __thiscall FileTokenizer::parseOperator(FileTokenizer *this)

{
  undefined1 uVar1;
  size_t sVar2;
  undefined1 *puVar3;
  ulong uVar4;
  char *pcVar5;
  char local_31;
  char second;
  char first;
  FileTokenizer *this_local;
  
  puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&this->currentLine);
  uVar1 = *puVar3;
  sVar2 = this->linePos;
  uVar4 = std::__cxx11::string::size();
  if (sVar2 + 1 < uVar4) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->currentLine);
    local_31 = *pcVar5;
  }
  else {
    local_31 = '\0';
  }
  switch(uVar1) {
  case 0x21:
    if (local_31 == '=') {
      createToken(this,NotEqual,2);
    }
    else {
      createToken(this,Exclamation,1);
    }
    this_local._7_1_ = true;
    break;
  case 0x23:
    createToken(this,Hash,1);
    this_local._7_1_ = true;
    break;
  case 0x24:
    createToken(this,Dollar,1);
    this_local._7_1_ = true;
    break;
  case 0x25:
    createToken(this,Mod,1);
    this_local._7_1_ = true;
    break;
  case 0x26:
    if (local_31 == '&') {
      createToken(this,LogAnd,2);
    }
    else {
      createToken(this,BitAnd,1);
    }
    this_local._7_1_ = true;
    break;
  case 0x28:
    createToken(this,LParen,1);
    this_local._7_1_ = true;
    break;
  case 0x29:
    createToken(this,RParen,1);
    this_local._7_1_ = true;
    break;
  case 0x2a:
    createToken(this,Mult,1);
    this_local._7_1_ = true;
    break;
  case 0x2b:
    createToken(this,Plus,1);
    this_local._7_1_ = true;
    break;
  case 0x2c:
    createToken(this,Comma,1);
    this_local._7_1_ = true;
    break;
  case 0x2d:
    createToken(this,Minus,1);
    this_local._7_1_ = true;
    break;
  case 0x2f:
    createToken(this,Div,1);
    this_local._7_1_ = true;
    break;
  case 0x3a:
    if (local_31 == ':') {
      createToken(this,Separator,2);
    }
    else {
      createToken(this,Colon,1);
    }
    this_local._7_1_ = true;
    break;
  case 0x3c:
    if (local_31 == '<') {
      createToken(this,LeftShift,2);
    }
    else if (local_31 == '=') {
      createToken(this,LessEqual,2);
    }
    else {
      createToken(this,Less,1);
    }
    this_local._7_1_ = true;
    break;
  case 0x3d:
    if (local_31 == '=') {
      createToken(this,Equal,2);
    }
    else {
      createToken(this,Assign,1);
    }
    this_local._7_1_ = true;
    break;
  case 0x3e:
    if (local_31 == '>') {
      createToken(this,RightShift,2);
    }
    else if (local_31 == '=') {
      createToken(this,GreaterEqual,2);
    }
    else {
      createToken(this,Greater,1);
    }
    this_local._7_1_ = true;
    break;
  case 0x3f:
    createToken(this,Question,1);
    this_local._7_1_ = true;
    break;
  case 0x5b:
    createToken(this,LBrack,1);
    this_local._7_1_ = true;
    break;
  case 0x5d:
    createToken(this,RBrack,1);
    this_local._7_1_ = true;
    break;
  case 0x5e:
    createToken(this,Caret,1);
    this_local._7_1_ = true;
    break;
  case 0x7b:
    createToken(this,LBrace,1);
    this_local._7_1_ = true;
    break;
  case 0x7c:
    if (local_31 == '|') {
      createToken(this,LogOr,2);
    }
    else {
      createToken(this,BitOr,1);
    }
    this_local._7_1_ = true;
    break;
  case 0x7d:
    createToken(this,RBrace,1);
    this_local._7_1_ = true;
    break;
  case 0x7e:
    createToken(this,Tilde,1);
    this_local._7_1_ = true;
    break;
  case 0xffffffc2:
    if (local_31 == -0x50) {
      createToken(this,Degree,2);
      return true;
    }
  default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FileTokenizer::parseOperator()
{
	char first = currentLine[linePos];
	char second = linePos+1 >= currentLine.size() ? '\0' : currentLine[linePos+1];

	switch (first)
	{
	case '(':
		createToken(TokenType::LParen,1);
		return true;
	case ')':
		createToken(TokenType::RParen,1);
		return true;
	case '+':
		createToken(TokenType::Plus,1);
		return true;
	case '-':
		createToken(TokenType::Minus,1);
		return true;
	case '*':
		createToken(TokenType::Mult,1);
		return true;
	case '/':
		createToken(TokenType::Div,1);
		return true;
	case '%':
		createToken(TokenType::Mod,1);
		return true;
	case '^':
		createToken(TokenType::Caret,1);
		return true;
	case '~':
		createToken(TokenType::Tilde,1);
		return true;
	case '<':
		if (second == '<')
			createToken(TokenType::LeftShift,2);
		else if (second == '=')
			createToken(TokenType::LessEqual,2);
		else
			createToken(TokenType::Less,1);
		return true;
	case '>':
		if (second == '>')
			createToken(TokenType::RightShift,2);
		else if (second == '=')
			createToken(TokenType::GreaterEqual,2);
		else
			createToken(TokenType::Greater,1);
		return true;
	case '=':
		if (second == '=')
			createToken(TokenType::Equal,2);
		else
			createToken(TokenType::Assign,1);
		return true;
	case '!':
		if (second == '=')
			createToken(TokenType::NotEqual,2);
		else
			createToken(TokenType::Exclamation,1);
		return true;
	case '&':
		if (second == '&')
			createToken(TokenType::LogAnd,2);
		else
			createToken(TokenType::BitAnd,1);
		return true;
	case '|':
		if (second == '|')
			createToken(TokenType::LogOr,2);
		else
			createToken(TokenType::BitOr,1);
		return true;
	case '?':
		createToken(TokenType::Question,1);
		return true;
	case ':':
		if (second == ':')
			createToken(TokenType::Separator,2);
		else
			createToken(TokenType::Colon,1);
		return true;
	case ',':
		createToken(TokenType::Comma,1);
		return true;
	case '[':
		createToken(TokenType::LBrack,1);
		return true;
	case ']':
		createToken(TokenType::RBrack,1);
		return true;
	case '#':
		createToken(TokenType::Hash,1);
		return true;
	case '{':
		createToken(TokenType::LBrace,1);
		return true;
	case '}':
		createToken(TokenType::RBrace,1);
		return true;
	case '$':
		createToken(TokenType::Dollar,1);
		return true;
	case char(0xC2):	// degree sign
		if (second == char(0xB0))
		{
			createToken(TokenType::Degree,2);
			return true;
		}
		break;
	}

	return false;
}